

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

int Llb_ManFlowBwdPath2_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsNode(pObj);
  if (((iVar1 == 0) && (iVar1 = Aig_ObjIsCi(pObj), iVar1 == 0)) &&
     (iVar1 = Aig_ObjIsConst1(pObj), iVar1 == 0)) {
    __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                  ,0x227,"int Llb_ManFlowBwdPath2_rec(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    pAVar2 = Llb_ObjGetPath(pObj);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      if ((*(ulong *)&pObj->field_0x18 >> 4 & 1) == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 != 0) {
          pAVar2 = Aig_ObjFanin0(pObj);
          iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar2);
          if (iVar1 != 0) {
            pAVar2 = Aig_ObjFanin0(pObj);
            iVar1 = Llb_ObjSetPath(pObj,pAVar2);
            return iVar1;
          }
          pAVar2 = Aig_ObjFanin1(pObj);
          iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar2);
          if (iVar1 != 0) {
            pAVar2 = Aig_ObjFanin1(pObj);
            iVar1 = Llb_ObjSetPath(pObj,pAVar2);
            return iVar1;
          }
        }
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = Llb_ObjSetPath(pObj,(Aig_Obj_t *)0x1);
      }
    }
    else {
      pAVar2 = Llb_ObjGetFanoutPath(p,pObj);
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = Aig_ObjIsNode(pAVar2);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pFanout)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                        ,0x247,"int Llb_ManFlowBwdPath2_rec(Aig_Man_t *, Aig_Obj_t *)");
        }
        pAVar3 = Aig_ObjFanin0(pAVar2);
        iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar3);
        if (iVar1 == 0) {
          pAVar3 = Aig_ObjFanin1(pAVar2);
          iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar3);
          if (iVar1 == 0) {
            iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar2);
            if (iVar1 == 0) {
              p_local._4_4_ = 0;
            }
            else {
              p_local._4_4_ = Llb_ObjSetPath(pAVar2,(Aig_Obj_t *)0x0);
            }
          }
          else {
            pAVar3 = Aig_ObjFanin1(pAVar2);
            p_local._4_4_ = Llb_ObjSetPath(pAVar2,pAVar3);
          }
        }
        else {
          pAVar3 = Aig_ObjFanin0(pAVar2);
          p_local._4_4_ = Llb_ObjSetPath(pAVar2,pAVar3);
        }
      }
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Llb_ManFlowBwdPath2_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) );
    // skip visited nodes
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Aig_ObjSetTravIdCurrent(p, pObj);
    // process node without flow
    if ( !Llb_ObjGetPath(pObj) )
    {
        // start the path if we reached a terminal node
        if ( pObj->fMarkA )
            return Llb_ObjSetPath( pObj, (Aig_Obj_t *)1 );
        // explore the fanins
//        Abc_ObjForEachFanin( pObj, pFanin, i )
//            if ( Abc_NtkMaxFlowBwdPath2_rec(pFanin) )
//                return Abc_ObjSetPath( pObj, pFanin );
        if ( Aig_ObjIsNode(pObj) )
        {
            if ( Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) ) )
                return Llb_ObjSetPath( pObj, Aig_ObjFanin0(pObj) );
            if ( Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) ) )
                return Llb_ObjSetPath( pObj, Aig_ObjFanin1(pObj) );
        }
        return 0;
    }
    // pObj has flow - find the fanout with flow
    pFanout = Llb_ObjGetFanoutPath( p, pObj );
    if ( pFanout == NULL )
        return 0;
    // go through the fanins of the fanout with flow
//    Abc_ObjForEachFanin( pFanout, pFanin, i )
//        if ( Abc_NtkMaxFlowBwdPath2_rec( pFanin ) )
//            return Abc_ObjSetPath( pFanout, pFanin );
    assert( Aig_ObjIsNode(pFanout) );
    if ( Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pFanout) ) )
        return Llb_ObjSetPath( pFanout, Aig_ObjFanin0(pFanout) );
    if ( Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pFanout) ) )
        return Llb_ObjSetPath( pFanout, Aig_ObjFanin1(pFanout) );
    // try the fanout
    if ( Llb_ManFlowBwdPath2_rec( p, pFanout ) )
        return Llb_ObjSetPath( pFanout, NULL );
    return 0;
}